

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

object * get_random_monster_object(monster *mon)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t local_24;
  object *poStack_20;
  wchar_t i;
  object *pick;
  object *obj;
  monster *mon_local;
  
  poStack_20 = (object *)0x0;
  local_24 = 1;
  for (pick = mon->held_obj; pick != (object *)0x0; pick = pick->next) {
    if ((pick->artifact == (artifact *)0x0) ||
       (_Var1 = quest_unique_monster_check(mon->race), !_Var1)) {
      uVar2 = Rand_div(local_24);
      if (uVar2 == 0) {
        poStack_20 = pick;
      }
      local_24 = local_24 + 1;
    }
  }
  return poStack_20;
}

Assistant:

struct object *get_random_monster_object(struct monster *mon)
{
    struct object *obj, *pick = NULL;
    int i = 1;

    /* Pick a random object */
    for (obj = mon->held_obj; obj; obj = obj->next) {
        /* Check it isn't a quest artifact */
        if (obj->artifact && quest_unique_monster_check(mon->race))
            continue;

        if (one_in_(i)) pick = obj;
        i++;
    }

    return pick;
}